

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O1

unsigned_short
pstore::sparse_array<int,unsigned_short>::
bitmap<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
          (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           first,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 last)

{
  ulong uVar1;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    if (first._M_current == last._M_current) {
      return (unsigned_short)uVar2;
    }
    uVar1 = *first._M_current;
    if (0xf < uVar1) break;
    if (((uVar2 & 0xffff) >> ((uint)uVar1 & 0x1f) & 1) != 0) {
      assert_failed("(mm & mask) == 0U && \"The same index must not appear more than once in the \" \"collection of sparse indices\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp"
                    ,0x25d);
    }
    uVar2 = uVar2 | 1 << ((byte)uVar1 & 0x1f);
    first._M_current = first._M_current + 1;
  }
  assert_failed("idx < max_size ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp"
                ,0x259);
}

Assistant:

BitmapType sparse_array<ValueType, BitmapType>::bitmap (InputIterator first,
                                                            InputIterator last) {
        return std::accumulate (
            first, last, BitmapType{0U},
            [] (BitmapType const mm, typename std::iterator_traits<InputIterator>::value_type const idx) {
                PSTORE_ASSERT (idx < max_size ());
                auto const mask = BitmapType{1U} << idx;
                PSTORE_ASSERT ((mm & mask) == 0U &&
                               "The same index must not appear more than once in the "
                               "collection of sparse indices");
                return static_cast<BitmapType> (mm | mask);
            });
    }